

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool op_qaddsub(DisasContext_conflict1 *s,arg_rrr *a,_Bool add,_Bool doub)

{
  int iVar1;
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *s_01;
  TCGTemp *pTVar2;
  code *func;
  TCGv_i32 var;
  uintptr_t o;
  TCGv_i32 var_00;
  TCGContext_conflict1 *tcg_ctx;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  s_00 = s->uc->tcg_ctx;
  if (s->thumb == 0) {
    if ((short)s->features < 0) goto LAB_0065b386;
  }
  else if ((s->features >> 0x22 & 1) != 0) {
LAB_0065b386:
    iVar1 = a->rm;
    pTVar2 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    var = (TCGv_i32)((long)pTVar2 - (long)s_00);
    load_reg_var(s,var,iVar1);
    iVar1 = a->rn;
    s_01 = s->uc->tcg_ctx;
    pTVar2 = tcg_temp_new_internal_aarch64(s_01,TCG_TYPE_I32,false);
    var_00 = (TCGv_i32)((long)pTVar2 - (long)s_01);
    load_reg_var(s,var_00,iVar1);
    if (doub) {
      local_48 = (TCGTemp *)(s_00->cpu_env + (long)s_00);
      local_40 = (TCGTemp *)((long)s_00 + (long)var_00);
      local_38 = local_40;
      tcg_gen_callN_aarch64(s_00,helper_add_saturate_aarch64,local_40,3,&local_48);
    }
    local_48 = (TCGTemp *)(s_00->cpu_env + (long)s_00);
    local_40 = (TCGTemp *)((long)s_00 + (long)var);
    if (add) {
      func = helper_add_saturate_aarch64;
    }
    else {
      func = helper_sub_saturate_aarch64;
    }
    local_38 = (TCGTemp *)(var_00 + (long)s_00);
    tcg_gen_callN_aarch64(s_00,func,local_40,3,&local_48);
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(var_00 + (long)s_00));
    store_reg(s,a->rd,var);
    return true;
  }
  return false;
}

Assistant:

static bool op_qaddsub(DisasContext *s, arg_rrr *a, bool add, bool doub)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t0, t1;

    if (s->thumb
        ? !arm_dc_feature(s, ARM_FEATURE_THUMB_DSP)
        : !ENABLE_ARCH_5TE) {
        return false;
    }

    t0 = load_reg(s, a->rm);
    t1 = load_reg(s, a->rn);
    if (doub) {
        gen_helper_add_saturate(tcg_ctx, t1, tcg_ctx->cpu_env, t1, t1);
    }
    if (add) {
        gen_helper_add_saturate(tcg_ctx, t0, tcg_ctx->cpu_env, t0, t1);
    } else {
        gen_helper_sub_saturate(tcg_ctx, t0, tcg_ctx->cpu_env, t0, t1);
    }
    tcg_temp_free_i32(tcg_ctx, t1);
    store_reg(s, a->rd, t0);
    return true;
}